

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

int ZSTDMT_serialState_reset
              (serialState_t *serialState,ZSTDMT_seqPool *seqPool,ZSTD_CCtx_params params,
              size_t jobSize,void *dict,size_t dictSize)

{
  ldmState_t *state;
  U32 UVar1;
  U32 UVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  bool bVar5;
  U32 UVar6;
  U32 UVar7;
  ZSTD_allocFunction p_Var8;
  ZSTD_freeFunction p_Var9;
  void *pvVar10;
  uint uVar11;
  size_t __size;
  ldmEntry_t *__ptr;
  BYTE *pBVar12;
  ulong uVar13;
  U64 UVar14;
  size_t __size_00;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  
  if (params.ldmParams.enableLdm == 0) {
    params.ldmParams.enableLdm = 0;
    params.ldmParams.hashLog = 0;
    params.ldmParams.bucketSizeLog = 0;
    params.ldmParams.minMatchLength = 0;
    params.ldmParams.hashRateLog = 0;
    params.ldmParams.windowLog = 0;
    uVar13 = 0;
  }
  else {
    ZSTD_ldm_adjustParameters(&params.ldmParams,&params.cParams);
    if (params.ldmParams.hashLog < params.ldmParams.bucketSizeLog) {
      __assert_fail("params.ldmParams.hashLog >= params.ldmParams.bucketSizeLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4c36,
                    "int ZSTDMT_serialState_reset(serialState_t *, ZSTDMT_seqPool *, ZSTD_CCtx_params, size_t, const void *, const size_t)"
                   );
    }
    if (0x1f < params.ldmParams.hashRateLog) {
      __assert_fail("params.ldmParams.hashRateLog < 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4c37,
                    "int ZSTDMT_serialState_reset(serialState_t *, ZSTDMT_seqPool *, ZSTD_CCtx_params, size_t, const void *, const size_t)"
                   );
    }
    uVar13 = (ulong)params.ldmParams.minMatchLength;
    if (params.ldmParams.minMatchLength - 1 == 0) {
      UVar14 = 1;
    }
    else {
      lVar16 = -0x30e44323485a9b9d;
      UVar14 = 1;
      uVar17 = (ulong)(params.ldmParams.minMatchLength - 1);
      do {
        lVar18 = lVar16;
        if ((uVar17 & 1) == 0) {
          lVar18 = 1;
        }
        UVar14 = UVar14 * lVar18;
        lVar16 = lVar16 * lVar16;
        bVar5 = 1 < uVar17;
        uVar17 = uVar17 >> 1;
      } while (bVar5);
    }
    (serialState->ldmState).hashPower = UVar14;
  }
  pvVar10 = params.customMem.opaque;
  p_Var9 = params.customMem.customFree;
  p_Var8 = params.customMem.customAlloc;
  UVar6 = params.ldmParams.hashLog;
  serialState->nextJobID = 0;
  if (params.fParams.checksumFlag != 0) {
    (serialState->xxhState).total_len = 0;
    (serialState->xxhState).v1 = 0x60ea27eeadc0b5d6;
    (serialState->xxhState).v2 = 0xc2b2ae3d27d4eb4f;
    (serialState->xxhState).v3 = 0;
    (serialState->xxhState).v4 = 0x61c8864e7a143579;
    (serialState->xxhState).mem64[0] = 0;
    (serialState->xxhState).mem64[1] = 0;
    (serialState->xxhState).mem64[2] = 0;
    (serialState->xxhState).mem64[3] = 0;
    (serialState->xxhState).memsize = 0;
    (serialState->xxhState).reserved[0] = 0;
  }
  if (params.ldmParams.enableLdm == 0) goto LAB_00162086;
  __size_00 = 8L << ((byte)params.ldmParams.hashLog & 0x3f);
  uVar15 = params.ldmParams.hashLog - params.ldmParams.bucketSizeLog;
  __size = 1L << ((byte)uVar15 & 0x3f);
  UVar1 = (serialState->params).ldmParams.hashLog;
  UVar2 = (serialState->params).ldmParams.bucketSizeLog;
  pthread_mutex_lock((pthread_mutex_t *)seqPool);
  seqPool->bufferSize = (jobSize / uVar13) * 0xc;
  pthread_mutex_unlock((pthread_mutex_t *)seqPool);
  (serialState->ldmState).window.base = "";
  (serialState->ldmState).window.dictBase = "";
  (serialState->ldmState).window.dictLimit = 1;
  (serialState->ldmState).window.lowLimit = 1;
  (serialState->ldmState).window.nextSrc =
       (BYTE *)"num chunks = %li (bit plane) and %li (exponent) \n";
  (serialState->ldmWindow).nextSrc = (serialState->ldmState).window.nextSrc;
  (serialState->ldmWindow).base = (serialState->ldmState).window.base;
  (serialState->ldmWindow).dictBase = (serialState->ldmState).window.dictBase;
  UVar7 = (serialState->ldmState).window.lowLimit;
  (serialState->ldmWindow).dictLimit = (serialState->ldmState).window.dictLimit;
  (serialState->ldmWindow).lowLimit = UVar7;
  __ptr = (serialState->ldmState).hashTable;
  if (__ptr == (ldmEntry_t *)0x0) {
LAB_00161eac:
    if (p_Var8 == (ZSTD_allocFunction)0x0) {
      __ptr = (ldmEntry_t *)malloc(__size_00);
    }
    else {
      __ptr = (ldmEntry_t *)(*p_Var8)(pvVar10,__size_00);
    }
    (serialState->ldmState).hashTable = __ptr;
  }
  else if ((serialState->params).ldmParams.hashLog < UVar6) {
    if (p_Var9 == (ZSTD_freeFunction)0x0) {
      free(__ptr);
    }
    else {
      (*p_Var9)(pvVar10,__ptr);
    }
    goto LAB_00161eac;
  }
  pBVar12 = (serialState->ldmState).bucketOffsets;
  if ((pBVar12 == (BYTE *)0x0) || (UVar1 - UVar2 < uVar15)) {
    if (pBVar12 != (BYTE *)0x0) {
      if (p_Var9 == (ZSTD_freeFunction)0x0) {
        free(pBVar12);
      }
      else {
        (*p_Var9)(pvVar10,pBVar12);
      }
    }
    if (p_Var8 == (ZSTD_allocFunction)0x0) {
      pBVar12 = (BYTE *)malloc(__size);
    }
    else {
      pBVar12 = (BYTE *)(*p_Var8)(pvVar10,__size);
    }
    (serialState->ldmState).bucketOffsets = pBVar12;
    __ptr = (serialState->ldmState).hashTable;
    if (__ptr == (ldmEntry_t *)0x0) {
      return 1;
    }
    if (pBVar12 == (BYTE *)0x0) {
      return 1;
    }
  }
  else if (__ptr == (ldmEntry_t *)0x0) {
    return 1;
  }
  memset(__ptr,0,__size_00);
  memset((serialState->ldmState).bucketOffsets,0,__size);
  if (dict != (void *)0x0) {
    state = &serialState->ldmState;
    if (dictSize != 0) {
      pBVar12 = (serialState->ldmState).window.base;
      if (pBVar12 == (BYTE *)0x0) {
        __assert_fail("window->base != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2226,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t)");
      }
      pBVar3 = (serialState->ldmState).window.dictBase;
      if (pBVar3 == (BYTE *)0x0) {
        __assert_fail("window->dictBase != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2227,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t)");
      }
      pBVar4 = (state->window).nextSrc;
      if (pBVar4 == (BYTE *)dict) {
        uVar13 = (ulong)(serialState->ldmState).window.dictLimit;
        pBVar12 = pBVar3;
        uVar15 = (serialState->ldmState).window.lowLimit;
      }
      else {
        uVar13 = (long)pBVar4 - (long)pBVar12;
        uVar15 = (serialState->ldmState).window.dictLimit;
        (serialState->ldmState).window.lowLimit = uVar15;
        if (uVar13 >> 0x20 != 0) {
          __assert_fail("distanceFromBase == (size_t)(U32)distanceFromBase",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x222e,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t)");
        }
        uVar11 = (uint)uVar13;
        (serialState->ldmState).window.dictLimit = uVar11;
        (serialState->ldmState).window.dictBase = pBVar12;
        (serialState->ldmState).window.base = (BYTE *)((long)dict - uVar13);
        if (uVar11 - uVar15 < 8) {
          (serialState->ldmState).window.lowLimit = uVar11;
          uVar15 = uVar11;
        }
      }
      pBVar3 = (BYTE *)((long)dict + dictSize);
      (state->window).nextSrc = pBVar3;
      if ((pBVar12 + uVar15 < pBVar3) && (dict < pBVar12 + (uVar13 & 0xffffffff))) {
        UVar6 = (U32)((long)pBVar3 - (long)pBVar12);
        if ((long)(uVar13 & 0xffffffff) < (long)pBVar3 - (long)pBVar12) {
          UVar6 = (U32)uVar13;
        }
        (serialState->ldmState).window.lowLimit = UVar6;
      }
    }
    ZSTD_ldm_fillHashTable(state,(BYTE *)dict,(BYTE *)(dictSize + (long)dict),&params.ldmParams);
  }
LAB_00162086:
  memcpy(&serialState->params,&params,0x90);
  (serialState->params).jobSize = jobSize & 0xffffffff;
  return 0;
}

Assistant:

static int ZSTDMT_serialState_reset(serialState_t* serialState,
                        ZSTDMT_seqPool* seqPool, ZSTD_CCtx_params params,
                        size_t jobSize, const void* dict, size_t const dictSize)
{
    /* Adjust parameters */
    if (params.ldmParams.enableLdm) {
        DEBUGLOG(4, "LDM window size = %u KB", (1U << params.cParams.windowLog) >> 10);
        ZSTD_ldm_adjustParameters(&params.ldmParams, &params.cParams);
        assert(params.ldmParams.hashLog >= params.ldmParams.bucketSizeLog);
        assert(params.ldmParams.hashRateLog < 32);
        serialState->ldmState.hashPower =
                ZSTD_rollingHash_primePower(params.ldmParams.minMatchLength);
    } else {
        memset(&params.ldmParams, 0, sizeof(params.ldmParams));
    }
    serialState->nextJobID = 0;
    if (params.fParams.checksumFlag)
        XXH64_reset(&serialState->xxhState, 0);
    if (params.ldmParams.enableLdm) {
        ZSTD_customMem cMem = params.customMem;
        unsigned const hashLog = params.ldmParams.hashLog;
        size_t const hashSize = ((size_t)1 << hashLog) * sizeof(ldmEntry_t);
        unsigned const bucketLog =
            params.ldmParams.hashLog - params.ldmParams.bucketSizeLog;
        size_t const bucketSize = (size_t)1 << bucketLog;
        unsigned const prevBucketLog =
            serialState->params.ldmParams.hashLog -
            serialState->params.ldmParams.bucketSizeLog;
        /* Size the seq pool tables */
        ZSTDMT_setNbSeq(seqPool, ZSTD_ldm_getMaxNbSeq(params.ldmParams, jobSize));
        /* Reset the window */
        ZSTD_window_init(&serialState->ldmState.window);
        serialState->ldmWindow = serialState->ldmState.window;
        /* Resize tables and output space if necessary. */
        if (serialState->ldmState.hashTable == NULL || serialState->params.ldmParams.hashLog < hashLog) {
            ZSTD_free(serialState->ldmState.hashTable, cMem);
            serialState->ldmState.hashTable = (ldmEntry_t*)ZSTD_malloc(hashSize, cMem);
        }
        if (serialState->ldmState.bucketOffsets == NULL || prevBucketLog < bucketLog) {
            ZSTD_free(serialState->ldmState.bucketOffsets, cMem);
            serialState->ldmState.bucketOffsets = (BYTE*)ZSTD_malloc(bucketSize, cMem);
        }
        if (!serialState->ldmState.hashTable || !serialState->ldmState.bucketOffsets)
            return 1;
        /* Zero the tables */
        memset(serialState->ldmState.hashTable, 0, hashSize);
        memset(serialState->ldmState.bucketOffsets, 0, bucketSize);
    }

    /* Update window state and fill hash table with dict */
    if (params.ldmParams.enableLdm && dict) {
        ZSTD_window_update(&serialState->ldmState.window, dict, dictSize);
        ZSTD_ldm_fillHashTable(&serialState->ldmState, (const BYTE*)dict, (const BYTE*)dict + dictSize, &params.ldmParams);
    }

    serialState->params = params;
    serialState->params.jobSize = (U32)jobSize;
    return 0;
}